

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawTableCell
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,
          PaintContext *cell_context,QTextTable *table,QTextTableData *td,int r,int c,
          QTextBlock *cursorBlockNeedingRepaint,QPointF *cursorBlockOffset)

{
  bool bVar1;
  Iterator it;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QFixed QVar6;
  QFixed QVar7;
  int iVar8;
  int iVar9;
  BorderStyle style;
  QBrush *other;
  QPen *p;
  QPoint QVar10;
  int iVar11;
  long in_FS_OFFSET;
  double bottomMargin;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  QSizeF QVar21;
  QBrush bg;
  QPen oldPen;
  QBrush oldBrush;
  double local_140;
  int local_e4;
  QBrush local_e0;
  QBrush local_d8;
  undefined1 local_d0 [8];
  iterator local_c8;
  QRectF local_a8;
  undefined1 local_88 [24];
  double dStack_70;
  undefined1 local_68 [8];
  qreal qStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextTable *)local_48,(int)table,r);
  iVar4 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
  iVar5 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
  if (((iVar4 != 1) && (iVar4 = QTextTableCell::row((QTextTableCell *)local_48), iVar4 != r)) ||
     ((iVar5 != 1 && (iVar4 = QTextTableCell::column((QTextTableCell *)local_48), iVar4 != c))))
  goto LAB_004e42a2;
  QVar6 = QTextTableData::leftPadding(td,table,(QTextTableCell *)local_48);
  QVar7 = QTextTableData::topPadding(td,table,(QTextTableCell *)local_48);
  iVar11 = (td->super_QTextFrameData).border.val + (td->cellSpacing).val;
  local_140 = (double)((td->super_QTextFrameData).effectiveTopMargin.val + iVar11) * 0.015625;
  iVar4 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  QTextTable::format((QTextTable *)local_88);
  iVar8 = QTextFormat::intProperty((QTextFormat *)local_88,0x4104);
  iVar9 = QTextTable::rows(table);
  iVar5 = iVar9 + -1;
  if (iVar8 < iVar9 + -1) {
    iVar5 = iVar8;
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if (iVar5 <= r) {
    local_140 = local_140 + (double)(td->headerHeight).val * 0.015625;
  }
  QTextTableCell::format((QTextTableCell *)local_88);
  bVar2 = QTextFormat::hasProperty((QTextFormat *)local_88,0x4818);
  bVar3 = true;
  if (!bVar2) {
    QTextTableCell::format((QTextTableCell *)&local_a8);
    bVar2 = QTextFormat::hasProperty((QTextFormat *)&local_a8,0x4816);
    bVar3 = true;
    if (!bVar2) {
      QTextTableCell::format((QTextTableCell *)local_58);
      bVar2 = QTextFormat::hasProperty((QTextFormat *)local_58,0x4819);
      bVar3 = true;
      if (!bVar2) {
        QTextTableCell::format((QTextTableCell *)local_68);
        bVar3 = QTextFormat::hasProperty((QTextFormat *)local_68,0x4817);
        QTextFormat::~QTextFormat((QTextFormat *)local_68);
      }
      QTextFormat::~QTextFormat((QTextFormat *)local_58);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_a8);
  }
  bottomMargin = (double)(iVar11 + iVar4) * 0.015625;
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if ((td->borderCollapse == false) &&
     ((td->super_QTextFrameData).border.val != 0 && bVar3 == false)) {
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    other = QPainter::brush(painter);
    QBrush::QBrush((QBrush *)local_58,other);
    local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    p = QPainter::pen(painter);
    QPen::QPen((QPen *)local_68,p);
    local_88._8_8_ = cellRect->yp + -1.0;
    local_88._0_8_ = cellRect->xp + -1.0;
    dStack_70 = cellRect->h + 1.0;
    local_88._16_8_ = cellRect->w + 1.0;
    QTextTable::format((QTextTable *)&local_a8);
    style = QTextFormat::intProperty((QTextFormat *)&local_a8,0x4010);
    QTextFormat::~QTextFormat((QTextFormat *)&local_a8);
    if (style - BorderStyle_Groove < 4) {
      style = *(BorderStyle *)(&DAT_006ac4a0 + (ulong)(style - BorderStyle_Groove) * 4);
    }
    QTextTable::format((QTextTable *)&local_a8);
    QTextFormat::brushProperty((QTextFormat *)local_d0,(int)&local_a8);
    drawBorder(this,painter,(QRectF *)local_88,local_140,bottomMargin,1.0,(QBrush *)local_d0,style);
    QBrush::~QBrush((QBrush *)local_d0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_a8);
    QPainter::setBrush(painter,(QBrush *)local_58);
    QPainter::setPen(painter,(QPen *)local_68);
    QPen::~QPen((QPen *)local_68);
    QBrush::~QBrush((QBrush *)local_58);
  }
  local_d0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextTableCell::format((QTextTableCell *)local_88);
  QTextFormat::brushProperty((QTextFormat *)local_d0,(int)(QTextFormat *)local_88);
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  QVar10 = QPainter::brushOrigin(painter);
  local_58._0_8_ = (undefined8)QVar10.xp.m_i.m_i;
  local_58._8_8_ = (undefined8)QVar10.yp.m_i.m_i;
  if (*(int *)((long)local_d0 + 4) != 0) {
    QVar21 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
    dVar14 = QVar21.ht;
    if (dVar14 <= 0.0) {
LAB_004e405d:
      QBrush::QBrush(&local_d8,(QBrush *)local_d0);
      local_a8.xp = cellRect->xp;
      local_a8.yp = cellRect->yp;
      stack0xffffffffffffff88 = (undefined1  [16])0x0;
      local_88._0_8_ = (totally_ordered_wrapper<QTextFormatPrivate_*>)0x0;
      local_88._8_4_ = 0;
      local_88._12_4_ = 0;
      fillBackground(painter,cellRect,&local_d8,(QPointF *)&local_a8,(QRectF *)local_88);
      QBrush::~QBrush(&local_d8);
    }
    else {
      auVar13._8_8_ = cellRect->h + cellRect->yp;
      auVar13._0_8_ = cellRect->yp;
      auVar17._8_8_ = dVar14;
      auVar17._0_8_ = dVar14;
      auVar13 = divpd(auVar13,auVar17);
      iVar4 = (int)auVar13._0_8_;
      iVar5 = (int)auVar13._8_8_;
      if (iVar4 == iVar5) goto LAB_004e405d;
      if (iVar4 <= iVar5) {
        do {
          dVar12 = cellRect->xp;
          dVar20 = cellRect->yp;
          dVar15 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
          bVar2 = 2147483647.0 < dVar15;
          if (dVar15 <= -2147483648.0) {
            dVar15 = -2147483648.0;
          }
          dVar18 = (double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar15);
          iVar8 = (int)dVar18;
          dVar15 = (double)((ulong)dVar20 & 0x8000000000000000 | 0x3fe0000000000000) + dVar20;
          bVar2 = 2147483647.0 < dVar15;
          if (dVar15 <= -2147483648.0) {
            dVar15 = -2147483648.0;
          }
          dVar15 = (double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar15);
          iVar9 = (int)dVar15;
          local_88._0_8_ = (undefined8)(int)dVar18;
          dVar12 = (dVar12 - (double)local_88._0_8_) * 0.5 + cellRect->w;
          dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
          bVar2 = 2147483647.0 < dVar12;
          if (dVar12 <= -2147483648.0) {
            dVar12 = -2147483648.0;
          }
          dVar15 = (double)(int)dVar15;
          dVar20 = (dVar20 - dVar15) * 0.5 + cellRect->h;
          dVar20 = (double)((ulong)dVar20 & 0x8000000000000000 | 0x3fe0000000000000) + dVar20;
          bVar1 = 2147483647.0 < dVar20;
          if (dVar20 <= -2147483648.0) {
            dVar20 = -2147483648.0;
          }
          dVar16 = (double)iVar4 * dVar14 + local_140;
          dVar18 = (cell_context->clip).yp;
          dVar19 = dVar18;
          if (dVar18 <= dVar16) {
            dVar19 = dVar16;
          }
          dVar16 = (double)(iVar4 + 1) * dVar14 + -bottomMargin;
          dVar18 = dVar18 + (cell_context->clip).h;
          if (dVar18 <= dVar16) {
            dVar16 = dVar18;
          }
          if (dVar19 <= dVar15) {
            dVar19 = dVar15;
          }
          local_88._8_8_ = dVar15 + (dVar19 - dVar15);
          dVar20 = ((double)(((long)(iVar9 + -1 +
                                    (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                                 ~-(ulong)bVar1 & (ulong)dVar20)) - (long)iVar9) + 1
                            ) - (dVar19 - dVar15)) + (double)local_88._8_8_;
          if (dVar16 <= dVar20) {
            dVar20 = dVar16;
          }
          dStack_70 = dVar20 - (double)local_88._8_8_;
          local_88._16_8_ =
               (double)(((long)(iVar8 + -1 +
                               (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                            ~-(ulong)bVar2 & (ulong)dVar12)) - (long)iVar8) + 1);
          if ((double)local_88._8_8_ < (dVar20 - (double)local_88._8_8_) + (double)local_88._8_8_) {
            QBrush::QBrush(&local_e0,(QBrush *)local_d0);
            local_68 = (undefined1  [8])cellRect->xp;
            qStack_60 = cellRect->yp;
            local_a8.w = 0.0;
            local_a8.h = 0.0;
            local_a8.xp = 0.0;
            local_a8.yp = 0.0;
            fillBackground(painter,(QRectF *)local_88,&local_e0,(QPointF *)local_68,&local_a8);
            QBrush::~QBrush(&local_e0);
          }
          bVar2 = iVar4 != iVar5;
          iVar4 = iVar4 + 1;
        } while (bVar2);
      }
    }
    if (1 < *(int *)((long)local_d0 + 4)) {
      local_88._0_16_ = *(undefined1 (*) [16])cellRect;
      QPainter::setBrushOrigin(painter,(QPointF *)local_88);
    }
  }
  if (bVar3 != false) {
    drawTableCellBorder(this,cellRect,painter,table,td,(QTextTableCell *)local_48);
  }
  iVar4 = QTextTable::columns(table);
  local_a8.xp = (double)QVar6.val * 0.015625 + cellRect->xp;
  local_a8.yp = (double)(QVar7.val + (td->cellVerticalOffsets).d.ptr[iVar4 * r + c].val) * 0.015625
                + cellRect->yp;
  local_68 = (undefined1  [8])0x0;
  qStack_60 = -3.720660661677042e-103;
  QTextTableCell::begin(&local_c8,(QTextTableCell *)local_48);
  iVar4 = QTextTable::rows(table);
  local_e4 = iVar4 * c + r;
  QMultiHash<int,_QTextFrame_*>::valuesImpl<int>
            ((QList<QTextFrame_*> *)local_88,&td->childFrameMap,&local_e4);
  it.b = local_c8.b;
  it.e = local_c8.e;
  it.f = local_c8.f;
  it.cf = local_c8.cf;
  it.cb = local_c8.cb;
  it._28_4_ = local_c8._28_4_;
  drawFlow(this,(QPointF *)&local_a8,painter,cell_context,it,(QList<QTextFrame_*> *)local_88,
           (QTextBlock *)local_68);
  if ((QTextFormatPrivate *)local_88._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,8,0x10);
    }
  }
  bVar2 = QTextBlock::isValid((QTextBlock *)local_68);
  if (bVar2) {
    cursorBlockNeedingRepaint->p = (QTextDocumentPrivate *)local_68;
    cursorBlockNeedingRepaint->n = qStack_60._0_4_;
    cursorBlockOffset->xp = local_a8.xp;
    cursorBlockOffset->yp = local_a8.yp;
  }
  if (1 < *(int *)((long)local_d0 + 4)) {
    QPainter::setBrushOrigin(painter,(QPointF *)local_58);
  }
  QBrush::~QBrush((QBrush *)local_d0);
LAB_004e42a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCell(const QRectF &cellRect, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &cell_context,
                                               QTextTable *table, QTextTableData *td, int r, int c,
                                               QTextBlock *cursorBlockNeedingRepaint, QPointF *cursorBlockOffset) const
{
    QTextTableCell cell = table->cellAt(r, c);
    int rspan = cell.rowSpan();
    int cspan = cell.columnSpan();
    if (rspan != 1) {
        int cr = cell.row();
        if (cr != r)
            return;
    }
    if (cspan != 1) {
        int cc = cell.column();
        if (cc != c)
            return;
    }

    const QFixed leftPadding = td->leftPadding(table, cell);
    const QFixed topPadding = td->topPadding(table, cell);

    qreal topMargin = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (r >= headerRowCount)
        topMargin += td->headerHeight.toReal();

    // If cell border configured, don't draw default border for cells. It will be taken care later by
    // drawTableCellBorder().
    bool cellBorderConfigured = (cell.format().hasProperty(QTextFormat::TableCellLeftBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellTopBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellRightBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellBottomBorder));

    if (!td->borderCollapse && td->border != 0 && !cellBorderConfigured) {
        const QBrush oldBrush = painter->brush();
        const QPen oldPen = painter->pen();

        // If border is configured for the table (and not explicitly for the cell), then
        // always draw 1px border around the cell
        const qreal border = 1;

        QRectF borderRect(cellRect.left() - border, cellRect.top() - border, cellRect.width() + border, cellRect.height() + border);

        // invert the border style for cells
        QTextFrameFormat::BorderStyle cellBorder = table->format().borderStyle();
        switch (cellBorder) {
        case QTextFrameFormat::BorderStyle_Inset:
            cellBorder = QTextFrameFormat::BorderStyle_Outset;
            break;
        case QTextFrameFormat::BorderStyle_Outset:
            cellBorder = QTextFrameFormat::BorderStyle_Inset;
            break;
        case QTextFrameFormat::BorderStyle_Groove:
            cellBorder = QTextFrameFormat::BorderStyle_Ridge;
            break;
        case QTextFrameFormat::BorderStyle_Ridge:
            cellBorder = QTextFrameFormat::BorderStyle_Groove;
            break;
        default:
            break;
        }

        drawBorder(painter, borderRect, topMargin, bottomMargin,
                   border, table->format().borderBrush(), cellBorder);

        painter->setBrush(oldBrush);
        painter->setPen(oldPen);
    }

    const QBrush bg = cell.format().background();
    const QPointF brushOrigin = painter->brushOrigin();
    if (bg.style() != Qt::NoBrush) {
        const qreal pageHeight = document->pageSize().height();
        const int topPage = pageHeight > 0 ? static_cast<int>(cellRect.top() / pageHeight) : 0;
        const int bottomPage = pageHeight > 0 ? static_cast<int>((cellRect.bottom()) / pageHeight) : 0;

        if (topPage == bottomPage)
            fillBackground(painter, cellRect, bg, cellRect.topLeft());
        else {
            for (int i = topPage; i <= bottomPage; ++i) {
                QRectF clipped = cellRect.toRect();

                if (topPage != bottomPage) {
                    const qreal top = qMax(i * pageHeight + topMargin, cell_context.clip.top());
                    const qreal bottom = qMin((i + 1) * pageHeight - bottomMargin, cell_context.clip.bottom());

                    clipped.setTop(qMax(clipped.top(), top));
                    clipped.setBottom(qMin(clipped.bottom(), bottom));

                    if (clipped.bottom() <= clipped.top())
                        continue;

                    fillBackground(painter, clipped, bg, cellRect.topLeft());
                }
            }
        }

        if (bg.style() > Qt::SolidPattern)
            painter->setBrushOrigin(cellRect.topLeft());
    }

    // paint over the background - otherwise we would have to adjust the background paint cellRect for the border values
    if (cellBorderConfigured)
        drawTableCellBorder(cellRect, painter, table, td, cell);

    const QFixed verticalOffset = td->cellVerticalOffsets.at(c + r * table->columns());

    const QPointF cellPos = QPointF(cellRect.left() + leftPadding.toReal(),
                                    cellRect.top() + (topPadding + verticalOffset).toReal());

    QTextBlock repaintBlock;
    drawFlow(cellPos, painter, cell_context, cell.begin(),
             td->childFrameMap.values(r + c * table->rows()),
             &repaintBlock);
    if (repaintBlock.isValid()) {
        *cursorBlockNeedingRepaint = repaintBlock;
        *cursorBlockOffset = cellPos;
    }

    if (bg.style() > Qt::SolidPattern)
        painter->setBrushOrigin(brushOrigin);
}